

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Query.cpp
# Opt level: O2

bool __thiscall adios2::query::BlockHit::applyIntersection(BlockHit *this,BlockHit *tmp)

{
  pointer ppVar1;
  bool bVar2;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  *box1;
  pointer ppVar3;
  Box<Dims> curr;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  b;
  Box<Dims> local_90;
  pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_60;
  
  if (this->m_ID == tmp->m_ID) {
    bVar2 = true;
    if ((this->m_Regions).
        super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->m_Regions).
        super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      ppVar3 = (tmp->m_Regions).
               super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar1 = (tmp->m_Regions).
               super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar1 != ppVar3) {
        bVar2 = false;
        for (; ppVar3 != ppVar1; ppVar3 = ppVar3 + 1) {
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::pair(&local_60,ppVar3);
          for (box1 = (this->m_Regions).
                      super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
              box1 != (this->m_Regions).
                      super__Vector_base<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish; box1 = box1 + 1) {
            QueryBase::GetIntersection(&local_90,box1,&local_60);
            if (local_90.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_finish !=
                local_90.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start) {
              bVar2 = true;
              std::
              pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::operator=(box1,&local_90);
            }
            std::
            pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
            ::~pair(&local_90);
          }
          std::
          pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::~pair(&local_60);
        }
      }
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool BlockHit::applyIntersection(const BlockHit &tmp)
{
    if (m_ID != tmp.m_ID)
        return false;

    // local array, no subblock info
    if (isLocalArrayBlock() || tmp.isLocalArrayBlock())
        return true;

    // check subblocks:
    bool overlapped = false;
    for (auto b : tmp.m_Regions)
    {
        for (auto it = m_Regions.begin(); it != m_Regions.end(); it++)
        {
            adios2::Box<Dims> curr = QueryBase::GetIntersection(*it, b);
            if (curr.first.size() != 0) // has intersection
            {
                overlapped = true;
                *it = curr;
            }
        }
    }

    return overlapped;
}